

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

uint8_t __thiscall m6502::SBC(m6502 *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  fetch(this);
  bVar1 = this->a;
  uVar3 = (this->status & 1) + (this->fetched ^ 0xff) + (uint)bVar1;
  bVar2 = (byte)uVar3;
  this->status = (byte)((bVar2 ^ bVar1) & ~(this->fetched ^ bVar1)) >> 1 & 0x40 |
                 bVar2 & 0x80 | this->status & 0x3c | 0xff < uVar3 | (bVar2 == 0) * '\x02';
  this->a = bVar2;
  return '\x01';
}

Assistant:

uint8_t SBC()
  {
    fetch();
    uint16_t value = (uint16_t)fetched ^ 0x00FFu;
    uint16_t tmp = (uint16_t)a + value + (uint16_t)GetFlag(C);
    SetFlag(C, tmp > 255);
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    SetFlag(V, (~((uint16_t)a ^ (uint16_t)fetched) &
                ((uint16_t)a ^ (uint16_t)tmp)) &
                   0x0080u);
    a = tmp & 0x00FF;
    return 1;
  }